

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# jcsample.c
# Opt level: O1

void h2v1_downsample(j_compress_ptr cinfo,jpeg_component_info *compptr,JSAMPARRAY input_data,
                    JSAMPARRAY output_data)

{
  uint uVar1;
  int iVar2;
  JSAMPROW pJVar3;
  JSAMPROW pJVar4;
  long lVar5;
  uint uVar6;
  long lVar7;
  
  uVar1 = compptr->width_in_blocks;
  iVar2 = cinfo->max_v_samp_factor;
  uVar6 = cinfo->image_width;
  if (0 < (int)(uVar1 * 0x10 - uVar6) && 0 < (long)iVar2) {
    lVar7 = 0;
    do {
      memset(input_data[lVar7] + uVar6,(uint)input_data[lVar7][(ulong)uVar6 - 1],
             (ulong)(uVar1 * 0x10 + ~uVar6) + 1);
      lVar7 = lVar7 + 1;
    } while (iVar2 != lVar7);
  }
  if (0 < compptr->v_samp_factor) {
    lVar7 = 0;
    do {
      if ((uVar1 & 0x1fffffff) != 0) {
        pJVar3 = input_data[lVar7];
        pJVar4 = output_data[lVar7];
        lVar5 = 0;
        uVar6 = 0;
        do {
          pJVar4[lVar5] = (JSAMPLE)(pJVar3[lVar5 * 2] + uVar6 + (uint)pJVar3[lVar5 * 2 + 1] >> 1);
          uVar6 = uVar6 ^ 1;
          lVar5 = lVar5 + 1;
        } while (uVar1 << 3 != (int)lVar5);
      }
      lVar7 = lVar7 + 1;
    } while (lVar7 < compptr->v_samp_factor);
  }
  return;
}

Assistant:

METHODDEF(void)
h2v1_downsample(j_compress_ptr cinfo, jpeg_component_info *compptr,
                JSAMPARRAY input_data, JSAMPARRAY output_data)
{
  int outrow;
  JDIMENSION outcol;
  JDIMENSION output_cols = compptr->width_in_blocks * DCTSIZE;
  register JSAMPROW inptr, outptr;
  register int bias;

  /* Expand input data enough to let all the output samples be generated
   * by the standard loop.  Special-casing padded output would be more
   * efficient.
   */
  expand_right_edge(input_data, cinfo->max_v_samp_factor, cinfo->image_width,
                    output_cols * 2);

  for (outrow = 0; outrow < compptr->v_samp_factor; outrow++) {
    outptr = output_data[outrow];
    inptr = input_data[outrow];
    bias = 0;                   /* bias = 0,1,0,1,... for successive samples */
    for (outcol = 0; outcol < output_cols; outcol++) {
      *outptr++ = (JSAMPLE)((inptr[0] + inptr[1] + bias) >> 1);
      bias ^= 1;                /* 0=>1, 1=>0 */
      inptr += 2;
    }
  }
}